

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O3

char * cimg_library::cimg::ftype(FILE *file,char *filename)

{
  byte bVar1;
  char cVar2;
  uint value;
  int iVar3;
  uint *puVar4;
  CImgArgumentException *this;
  long lVar5;
  char *pcVar6;
  char *pcVar7;
  bool bVar8;
  bool bVar9;
  CImg<char> header;
  CImgList<char> _header;
  CImg<char> r;
  
  if (file == (FILE *)0x0 && filename == (char *)0x0) {
    this = (CImgArgumentException *)__cxa_allocate_exception(0x10);
    CImgArgumentException::CImgArgumentException
              (this,"cimg::ftype(): Specified filename is (null).");
    __cxa_throw(this,&CImgArgumentException::typeinfo,CImgException::~CImgException);
  }
  header._data = (char *)0x0;
  header._width = 0;
  header._height = 0;
  header._depth = 0;
  header._spectrum = 0;
  header._is_shared = false;
  puVar4 = _exception_mode(0,false);
  value = *puVar4;
  _exception_mode(0,true);
  CImg<char>::_load_raw(&header,file,filename,0x200,1,1,1,false,false,0);
  pcVar6 = header._data;
  iVar3 = strncmp(header._data,"OFF\n",4);
  if (iVar3 == 0) {
    pcVar7 = "off";
    goto LAB_0011e71c;
  }
  iVar3 = strncmp(pcVar6,"#INRIMAGE",9);
  if (iVar3 == 0) {
    pcVar7 = "inr";
    goto LAB_0011e71c;
  }
  iVar3 = strncmp(pcVar6,"PANDORE",7);
  if (iVar3 == 0) {
    pcVar7 = "pan";
    goto LAB_0011e71c;
  }
  iVar3 = strncmp(pcVar6 + 0x80,"DICM",4);
  if (iVar3 == 0) {
    pcVar7 = "dcm";
    goto LAB_0011e71c;
  }
  bVar1 = *pcVar6;
  if (bVar1 < 0x4d) {
    if (bVar1 == 0x42) {
      if (pcVar6[1] == 'M') {
        pcVar7 = "bmp";
        goto LAB_0011e71c;
      }
    }
    else if (bVar1 == 0x47) {
      if ((((pcVar6[1] == 'I') && (pcVar6[2] == 'F')) && (pcVar6[3] == '8')) && (pcVar6[5] == 'a'))
      {
        pcVar7 = "gif";
        if ((pcVar6[4] == '7') || (pcVar6[4] == '9')) goto LAB_0011e71c;
      }
    }
    else if ((bVar1 == 0x49) && (pcVar6[1] == 'I')) goto LAB_0011e5c5;
  }
  else if (bVar1 == 0x4d) {
    if (pcVar6[1] == 'M') {
LAB_0011e5c5:
      pcVar7 = "tif";
      goto LAB_0011e71c;
    }
  }
  else if (bVar1 == 0x89) {
    if (((((pcVar6[1] == 'P') && (pcVar6[2] == 'N')) && (pcVar6[3] == 'G')) &&
        ((pcVar6[4] == '\r' && (pcVar6[5] == '\n')))) &&
       ((pcVar6[6] == '\x1a' && (pcVar6[7] == '\n')))) {
      pcVar7 = "png";
      goto LAB_0011e71c;
    }
  }
  else if (((bVar1 == 0xff) && (pcVar6[1] == -0x28)) && (pcVar6[2] == -1)) {
    pcVar7 = "jpg";
    goto LAB_0011e71c;
  }
  CImg<char>::CImg(&r,1,1,1,1);
  *r._data = '\n';
  CImg<char>::get_split<char>((CImg<char> *)&_header,&header,(char)&r,false);
  if ((r._is_shared == false) && (r._data != (char *)0x0)) {
    operator_delete__(r._data);
  }
  if ((long)(int)_header._width < 1) {
LAB_0011e70f:
    pcVar7 = (char *)0x0;
  }
  else {
    pcVar7 = (char *)0x0;
    lVar5 = 0;
    do {
      pcVar6 = *(char **)((long)&(_header._data)->_data + lVar5);
      cVar2 = *pcVar6;
      if (cVar2 != '#') {
        if ((cVar2 != 'P') || (*(int *)((long)&(_header._data)->_height + lVar5) != 2))
        goto LAB_0011e70f;
        bVar1 = pcVar6[1];
        pcVar6 = (char *)0x0;
        bVar8 = 0xf6 < (byte)(bVar1 - 0x3a);
        if (bVar8) {
          pcVar6 = "pnm";
        }
        bVar9 = (bVar1 & 0xdf) != 0x46;
        pcVar7 = "pfm";
        if (bVar9) {
          pcVar7 = pcVar6;
        }
        if (bVar9 && !bVar8) goto LAB_0011e70f;
        break;
      }
      lVar5 = lVar5 + 0x20;
    } while ((long)(int)_header._width * 0x20 != lVar5);
  }
  CImgList<char>::~CImgList(&_header);
LAB_0011e71c:
  _exception_mode(value,true);
  if ((header._is_shared == false) && (header._data != (char *)0x0)) {
    operator_delete__(header._data);
  }
  return pcVar7;
}

Assistant:

inline const char *ftype(std::FILE *const file, const char *const filename) {
    if (!file && !filename)
      throw CImgArgumentException("cimg::ftype(): Specified filename is (null).");
    static const char
      *const _pnm = "pnm",
      *const _pfm = "pfm",
      *const _bmp = "bmp",
      *const _gif = "gif",
      *const _jpg = "jpg",
      *const _off = "off",
      *const _pan = "pan",
      *const _png = "png",
      *const _tif = "tif",
      *const _inr = "inr",
      *const _dcm = "dcm";
    const char *f_type = 0;
    CImg<char> header;
    const unsigned int omode = cimg::exception_mode();
    cimg::exception_mode(0);
    try {
      header._load_raw(file,filename,512,1,1,1,false,false,0);
      const unsigned char *const uheader = (unsigned char*)header._data;
      if (!std::strncmp(header,"OFF\n",4)) f_type = _off; // OFF.
      else if (!std::strncmp(header,"#INRIMAGE",9)) f_type = _inr; // INRIMAGE.
      else if (!std::strncmp(header,"PANDORE",7)) f_type = _pan; // PANDORE.
      else if (!std::strncmp(header.data() + 128,"DICM",4)) f_type = _dcm; // DICOM.
      else if (uheader[0]==0xFF && uheader[1]==0xD8 && uheader[2]==0xFF) f_type = _jpg;  // JPEG.
      else if (header[0]=='B' && header[1]=='M') f_type = _bmp;  // BMP.
      else if (header[0]=='G' && header[1]=='I' && header[2]=='F' && header[3]=='8' && header[5]=='a' && // GIF.
               (header[4]=='7' || header[4]=='9')) f_type = _gif;
      else if (uheader[0]==0x89 && uheader[1]==0x50 && uheader[2]==0x4E && uheader[3]==0x47 &&  // PNG.
               uheader[4]==0x0D && uheader[5]==0x0A && uheader[6]==0x1A && uheader[7]==0x0A) f_type = _png;
      else if ((uheader[0]==0x49 && uheader[1]==0x49) || (uheader[0]==0x4D && uheader[1]==0x4D)) f_type = _tif; // TIFF.
      else { // PNM or PFM.
        CImgList<char> _header = header.get_split(CImg<char>::vector('\n'),0,false);
        cimglist_for(_header,l) {
          if (_header(l,0)=='#') continue;
          if (_header[l]._height==2 && _header(l,0)=='P') {
            const char c = _header(l,1);
            if (c=='f' || c=='F') { f_type = _pfm; break; }
            if (c>='1' && c<='9') { f_type = _pnm; break; }
          }
          f_type = 0; break;
        }
      }
    } catch (CImgIOException&) { }
    cimg::exception_mode(omode);
    return f_type;
  }